

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

void HPack::huffman_encode_string(QByteArrayView inputData,BitOStream *outputStream)

{
  CodeEntry code;
  byte bVar1;
  qsizetype qVar2;
  quint64 qVar3;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  uchar value;
  int e;
  int i;
  BitOStream *in_stack_ffffffffffffffa8;
  int iVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffc8;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (undefined4)in_RDX;
  uVar7 = (undefined4)((ulong)in_RDX >> 0x20);
  iVar4 = 0;
  qVar2 = QByteArrayView::size(&local_18);
  for (; iVar4 < (int)qVar2; iVar4 = iVar4 + 1) {
    bVar1 = QByteArrayView::operator[](&local_18,(long)iVar4);
    code.huffmanCode = in_stack_ffffffffffffffc8;
    code.byteValue = uVar7;
    code.bitLength =
         (quint32)*(undefined8 *)
                   ((anonymous_namespace)::staticHuffmanCodeTable + (ulong)bVar1 * 0xc);
    anon_unknown_5::write_huffman_code(in_stack_ffffffffffffffa8,code);
  }
  qVar3 = BitOStream::bitLength((BitOStream *)CONCAT44(uVar7,uVar6));
  uVar5 = (undefined2)((uint)iVar4 >> 0x10);
  if ((qVar3 & 7) != 0) {
    BitOStream::bitLength((BitOStream *)CONCAT44(uVar7,uVar6));
    BitOStream::writeBits
              ((BitOStream *)CONCAT44(uVar7,uVar6),(uchar)((ushort)uVar5 >> 8),(quint8)uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void huffman_encode_string(QByteArrayView inputData, BitOStream &outputStream)
{
    for (int i = 0, e = inputData.size(); i < e; ++i) {
        const auto value = uchar(inputData[i]);
        write_huffman_code(outputStream, staticHuffmanCodeTable[value]);
    }

    // Pad bits ...
    if (outputStream.bitLength() % 8)
        outputStream.writeBits(0xff, 8 - outputStream.bitLength() % 8);
}